

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

bool __thiscall absl::Mutex::AwaitWithDeadline(Mutex *this,Condition *cond,Time deadline)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  undefined8 extraout_RDX;
  KernelTimeout t;
  Time t_00;
  
  if (cond->eval_ != (_func_bool_Condition_ptr *)0x0) {
    bVar1 = (*cond->eval_)(cond);
    if (!bVar1) {
      if ((absl *)deadline.rep_.rep_hi_ == (absl *)0x7fffffffffffffff &&
          deadline.rep_.rep_lo_ == 0xffffffff) {
        bVar1 = AwaitCommon(this,cond,(KernelTimeout)0x0);
        if (bVar1) {
          return true;
        }
      }
      else {
        t_00.rep_.rep_hi_ = (ulong)deadline.rep_.rep_lo_;
        t_00.rep_._8_8_ = extraout_RDX;
        iVar2 = ToUnixNanos((absl *)deadline.rep_.rep_hi_,t_00);
        iVar3 = 1;
        if (1 < iVar2) {
          iVar3 = iVar2;
        }
        t.ns_ = 0;
        if (iVar2 != 0x7fffffffffffffff) {
          t.ns_ = iVar3;
        }
        bVar1 = AwaitCommon(this,cond,t);
        if (iVar2 != 0x7fffffffffffffff || bVar1) {
          return bVar1;
        }
      }
      AwaitWithDeadline();
      return false;
    }
  }
  AssertReaderHeld(this);
  return true;
}

Assistant:

bool Mutex::AwaitWithDeadline(const Condition &cond, absl::Time deadline) {
  if (cond.Eval()) {      // condition already true; nothing to do
    if (kDebugMode) {
      this->AssertReaderHeld();
    }
    return true;
  }

  KernelTimeout t{deadline};
  bool res = this->AwaitCommon(cond, t);
  ABSL_RAW_CHECK(res || t.has_timeout(),
                 "condition untrue on return from Await");
  return res;
}